

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_>::truncate
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_> *this,char *__file,
          __off_t __length)

{
  OrphanBuilder *this_00;
  Orphan<capnp::compiler::Declaration> *pOVar1;
  OrphanBuilder *pOVar2;
  OrphanBuilder *pOVar3;
  
  pOVar1 = this->ptr;
  pOVar2 = &this->pos->builder;
  while (&pOVar1[(long)__file].builder < pOVar2) {
    this_00 = pOVar2 + -1;
    this->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *)this_00;
    pOVar3 = pOVar2 + -1;
    pOVar2 = this_00;
    if (pOVar3->segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize(this_00);
      pOVar2 = &this->pos->builder;
    }
  }
  return (int)pOVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }